

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void re2c::output_goto(OutputFile *o,uint32_t ind,bool *readCh,label_t to)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  string sStack_48;
  
  if (*readCh == true) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    InputAPI::stmt_peek_abi_cxx11_(&sStack_48,&poVar1->input_api,ind);
    OutputFile::wstring(o,&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
    *readCh = false;
  }
  pOVar2 = OutputFile::wind(o,ind);
  pOVar2 = OutputFile::ws(pOVar2,"goto ");
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  pOVar2 = OutputFile::wstring(pOVar2,&poVar1->labelPrefix);
  pOVar2 = OutputFile::wlabel(pOVar2,to);
  OutputFile::ws(pOVar2,";\n");
  return;
}

Assistant:

void output_goto (OutputFile & o, uint32_t ind, bool & readCh, label_t to)
{
	if (readCh)
	{
		o.wstring(opts->input_api.stmt_peek (ind));
		readCh = false;
	}
	o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(to).ws(";\n");
}